

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

set set_create(set_cb_hash hash_cb,set_cb_compare compare_cb)

{
  size_t sVar1;
  bucket pbVar2;
  set_cb_compare in_RSI;
  set_cb_hash in_RDI;
  set s;
  set local_8;
  
  if ((in_RDI == (set_cb_hash)0x0) || (in_RSI == (set_cb_compare)0x0)) {
    log_write_impl_va("metacall",0x4c,"set_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                      ,3,"Invalid set creation parameters");
    local_8 = (set)0x0;
  }
  else {
    local_8 = (set)malloc(0x30);
    if (local_8 == (set)0x0) {
      log_write_impl_va("metacall",0x54,"set_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                        ,3,"Bad set allocation");
      local_8 = (set)0x0;
    }
    else {
      local_8->hash_cb = in_RDI;
      local_8->compare_cb = in_RSI;
      local_8->count = 0;
      local_8->prime = 0;
      sVar1 = bucket_capacity(local_8->prime);
      local_8->capacity = sVar1;
      pbVar2 = bucket_create((size_t)in_RSI);
      local_8->buckets = pbVar2;
      if (local_8->buckets == (bucket)0x0) {
        log_write_impl_va("metacall",0x61,"set_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                          ,3,"Bad set bucket creation");
        free(local_8);
        local_8 = (set)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

set set_create(set_cb_hash hash_cb, set_cb_compare compare_cb)
{
	set s;

	if (hash_cb == NULL || compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set creation parameters");
		return NULL;
	}

	s = malloc(sizeof(struct set_type));

	if (s == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad set allocation");
		return NULL;
	}

	s->hash_cb = hash_cb;
	s->compare_cb = compare_cb;
	s->count = 0;
	s->prime = 0;
	s->capacity = bucket_capacity(s->prime);
	s->buckets = bucket_create(s->capacity);

	if (s->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad set bucket creation");
		free(s);
		return NULL;
	}

	return s;
}